

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

bool __thiscall QStyleSheetBorderData::isOpaque(QStyleSheetBorderData *this)

{
  int iVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -0x20;
  lVar3 = 0;
  do {
    if (lVar4 == 0) {
      if (((this->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) &&
         (cVar2 = QPixmap::hasAlpha(), cVar2 != '\0')) {
        return false;
      }
      return true;
    }
    iVar1 = *(int *)((long)this->styles + lVar3);
    if ((iVar1 != 1) && (iVar1 != 0xc)) {
      if (iVar1 != 4 && 0xfffffff9 < iVar1 - 8U) {
        return false;
      }
      cVar2 = QBrush::isOpaque();
      if (cVar2 == '\0') {
        return false;
      }
      if ((0 < *(int *)((long)&(((QSharedDataPointer<QStyleSheetBorderImageData> *)(this->radii + 4)
                                )->d).ptr + lVar4)) &&
         (0 < *(int *)((long)&(((QSharedDataPointer<QStyleSheetBorderImageData> *)(this->radii + 4))
                              ->d).ptr + lVar4 + 4))) {
        return false;
      }
    }
    lVar4 = lVar4 + 8;
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

bool isOpaque() const
    {
        for (int i = 0; i < 4; i++) {
            if (styles[i] == QCss::BorderStyle_Native || styles[i] == QCss::BorderStyle_None)
                continue;
            if (styles[i] >= QCss::BorderStyle_Dotted && styles[i] <= QCss::BorderStyle_DotDotDash
                && styles[i] != BorderStyle_Solid)
                return false;
            if (!colors[i].isOpaque())
                return false;
            if (!radii[i].isEmpty())
                return false;
        }
        if (bi != nullptr && bi->pixmap.hasAlpha())
            return false;
        return true;
    }